

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

bool __thiscall cmCTestGIT::LoadRevisions(cmCTestGIT *this)

{
  ostream *poVar1;
  cmsysProcess *cp_00;
  char *dir;
  char **cmd;
  undefined1 auVar2 [16];
  undefined1 local_308 [8];
  OutputLogger err;
  CommitParser out;
  cmsysProcess *cp;
  string local_108;
  undefined1 local_e8 [8];
  char *git_diff_tree [9];
  undefined1 local_98 [8];
  char *git_rev_list [6];
  char *git;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string range;
  cmCTestGIT *this_local;
  
  range.field_2._8_8_ = this;
  std::operator+(&local_50,&(this->super_cmCTestGlobalVC).OldRevision,"..");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,&(this->super_cmCTestGlobalVC).NewRevision);
  std::__cxx11::string::~string((string *)&local_50);
  local_98 = (undefined1  [8])std::__cxx11::string::c_str();
  git_rev_list[0] = "rev-list";
  git_rev_list[1] = "--reverse";
  git_rev_list[5] = (char *)local_98;
  auVar2 = std::__cxx11::string::c_str();
  git_rev_list[2] = auVar2._0_8_;
  git_rev_list[3] = "--";
  git_rev_list[4] = (char *)0x0;
  local_e8 = (undefined1  [8])git_rev_list[5];
  git_diff_tree[0] = "diff-tree";
  git_diff_tree[1] = "--stdin";
  git_diff_tree[2] = "--always";
  git_diff_tree[3] = "-z";
  git_diff_tree[4] = "-r";
  git_diff_tree[5] = "--pretty=raw";
  git_diff_tree[6] = "--encoding=utf-8";
  git_diff_tree[7] = (char *)0x0;
  poVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
  cmCTestVC::ComputeCommandLine_abi_cxx11_(&local_108,(cmCTestVC *)local_98,auVar2._8_8_);
  poVar1 = std::operator<<(poVar1,(string *)&local_108);
  poVar1 = std::operator<<(poVar1," | ");
  cmCTestVC::ComputeCommandLine_abi_cxx11_((string *)&cp,(cmCTestVC *)local_e8,cmd);
  poVar1 = std::operator<<(poVar1,(string *)&cp);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&cp);
  std::__cxx11::string::~string((string *)&local_108);
  cp_00 = cmsysProcess_New();
  cmsysProcess_AddCommand(cp_00,(char **)local_98);
  cmsysProcess_AddCommand(cp_00,(char **)local_e8);
  dir = (char *)std::__cxx11::string::c_str();
  cmsysProcess_SetWorkingDirectory(cp_00,dir);
  CommitParser::CommitParser((CommitParser *)&err.super_LineParser.Separator,this,"dt-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_308,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"dt-err> ")
  ;
  cmProcessTools::RunProcess
            (cp_00,(OutputParser *)&err.super_LineParser.Separator,(OutputParser *)local_308,UTF8);
  cmProcessTools::OutputParser::Process((OutputParser *)&err.super_LineParser.Separator,"",1);
  cmsysProcess_Delete(cp_00);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_308);
  CommitParser::~CommitParser((CommitParser *)&err.super_LineParser.Separator);
  std::__cxx11::string::~string((string *)local_30);
  return true;
}

Assistant:

bool cmCTestGIT::LoadRevisions()
{
  // Use 'git rev-list ... | git diff-tree ...' to get revisions.
  std::string range = this->OldRevision + ".." + this->NewRevision;
  const char* git = this->CommandLineTool.c_str();
  const char* git_rev_list[] = { git,           "rev-list", "--reverse",
                                 range.c_str(), "--",       nullptr };
  const char* git_diff_tree[] = {
    git,  "diff-tree",    "--stdin",          "--always", "-z",
    "-r", "--pretty=raw", "--encoding=utf-8", nullptr
  };
  this->Log << cmCTestGIT::ComputeCommandLine(git_rev_list) << " | "
            << cmCTestGIT::ComputeCommandLine(git_diff_tree) << "\n";

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_AddCommand(cp, git_rev_list);
  cmsysProcess_AddCommand(cp, git_diff_tree);
  cmsysProcess_SetWorkingDirectory(cp, this->SourceDirectory.c_str());

  CommitParser out(this, "dt-out> ");
  OutputLogger err(this->Log, "dt-err> ");
  cmCTestGIT::RunProcess(cp, &out, &err, cmProcessOutput::UTF8);

  // Send one extra zero-byte to terminate the last record.
  out.Process("", 1);

  cmsysProcess_Delete(cp);
  return true;
}